

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::RecursiveMessage::SharedDtor(MessageLite *self)

{
  MessageLite *self_00;
  ulong uVar1;
  undefined8 extraout_RAX;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[1]._internal_metadata_);
    self_00 = (MessageLite *)self[2]._vptr_MessageLite;
    if (self_00 != (MessageLite *)0x0) {
      SharedDtor(self_00);
    }
    operator_delete(self_00,0x28);
    return;
  }
  SharedDtor((RecursiveMessage *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void RecursiveMessage::SharedDtor(MessageLite& self) {
  RecursiveMessage& this_ = static_cast<RecursiveMessage&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.payload_.Destroy();
  delete this_._impl_.recurse_;
  this_._impl_.~Impl_();
}